

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_state.cc
# Opt level: O1

bool __thiscall TestState::Serialize(TestState *this,CBB *cbb)

{
  SSL_SESSION *in;
  bool bVar1;
  int iVar2;
  CBB out;
  CBB text;
  CBB pending;
  CBB CStack_a8;
  CBB local_78;
  CBB local_48;
  
  iVar2 = CBB_add_u24_length_prefixed(cbb,&CStack_a8);
  if (iVar2 != 0) {
    iVar2 = CBB_add_u16(&CStack_a8,0);
    if (iVar2 == 0) {
      return false;
    }
    iVar2 = CBB_add_u24_length_prefixed(&CStack_a8,&local_48);
    if (((iVar2 != 0) &&
        (((in = (this->pending_session)._M_t.
                super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl,
          in == (SSL_SESSION *)0x0 || (bVar1 = bssl::ssl_session_serialize(in,&local_48), bVar1)) &&
         (iVar2 = CBB_add_u16_length_prefixed(&CStack_a8,&local_78), iVar2 != 0)))) &&
       (((iVar2 = CBB_add_bytes(&local_78,(uint8_t *)(this->msg_callback_text)._M_dataplus._M_p,
                                (this->msg_callback_text)._M_string_length), iVar2 != 0 &&
         (iVar2 = CBB_add_asn1_uint64(&CStack_a8,g_clock.tv_sec), iVar2 != 0)) &&
        (iVar2 = CBB_add_asn1_uint64(&CStack_a8,g_clock.tv_usec), iVar2 != 0)))) {
      iVar2 = CBB_flush(cbb);
      return iVar2 != 0;
    }
  }
  return false;
}

Assistant:

bool TestState::Serialize(CBB *cbb) const {
  CBB out, pending, text;
  if (!CBB_add_u24_length_prefixed(cbb, &out) ||
      !CBB_add_u16(&out, 0 /* version */) ||
      !CBB_add_u24_length_prefixed(&out, &pending) ||
      (pending_session &&
       !ssl_session_serialize(pending_session.get(), &pending)) ||
      !CBB_add_u16_length_prefixed(&out, &text) ||
      !CBB_add_bytes(
          &text, reinterpret_cast<const uint8_t *>(msg_callback_text.data()),
          msg_callback_text.length()) ||
      !CBB_add_asn1_uint64(&out, g_clock.tv_sec) ||
      !CBB_add_asn1_uint64(&out, g_clock.tv_usec) ||
      !CBB_flush(cbb)) {
    return false;
  }
  return true;
}